

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JtagAnalyzerResults.cpp
# Opt level: O3

void __thiscall
JtagAnalyzerResults::GenerateExportFile
          (JtagAnalyzerResults *this,char *file,DisplayBase display_base,U32 export_type_user_id)

{
  byte bVar1;
  char cVar2;
  size_t sVar3;
  ostream *poVar4;
  _Base_ptr p_Var5;
  long lVar6;
  _Base_ptr p_Var7;
  char *pcVar8;
  TdiTdoStringFormat format;
  ulong uVar9;
  ulonglong uVar10;
  JtagAnalyzerResults *pJVar11;
  bool bVar12;
  string tdo_str;
  string tdi_str;
  string tdo_count_str;
  string tdi_count_str;
  Frame frm;
  JtagShiftedData sd;
  char time_str [128];
  ofstream file_stream;
  undefined1 auStack_3f8 [12];
  DisplayBase local_3ec;
  JtagAnalyzerResults *local_3e8;
  ulonglong local_3e0;
  uint local_3d4;
  string local_3d0;
  undefined2 local_3b0;
  _Base_ptr local_3a8;
  char *local_3a0;
  long local_398;
  char local_390 [16];
  char *local_380;
  long local_378;
  char local_370 [16];
  char *local_360;
  long local_358;
  char local_350 [16];
  char *local_340;
  long local_338;
  char local_330 [16];
  ulonglong local_320;
  pointer local_318;
  size_type sStack_310;
  size_type local_308;
  undefined8 uStack_300;
  undefined2 local_2f8;
  pointer local_2f0;
  void *local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  void *pvStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  char local_2b8 [136];
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  local_3ec = display_base;
  std::ofstream::ofstream(&local_230,file,_S_out);
  local_320 = Analyzer::GetTriggerSample();
  local_3e8 = this;
  local_3d4 = Analyzer::GetSampleRate();
  pcVar8 = "Time [s];TAP state;TDI;TDO";
  bVar12 = local_3e8->mSettings->mShowBitCount != false;
  if (bVar12) {
    pcVar8 = "Time [s];TAP state;TDI;TDO;TDIBitCount;TDOBitCount";
  }
  lVar6 = 0x1a;
  if (bVar12) {
    lVar6 = 0x32;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,pcVar8,lVar6);
  std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
  std::ostream::put((char)&local_230);
  std::ostream::flush();
  Frame::Frame((Frame *)&local_318);
  pJVar11 = local_3e8;
  local_2c8 = 0;
  uStack_2c0 = 0;
  local_2d8 = 0;
  pvStack_2d0 = (void *)0x0;
  local_2e8 = (void *)0x0;
  uStack_2e0 = 0;
  local_380 = local_370;
  local_378 = 0;
  local_370[0] = '\0';
  local_3a0 = local_390;
  local_398 = 0;
  local_390[0] = '\0';
  local_340 = local_330;
  local_338 = 0;
  local_330[0] = '\0';
  local_360 = local_350;
  local_358 = 0;
  local_350[0] = '\0';
  local_3e0 = AnalyzerResults::GetNumFrames();
  if (local_3e0 != 0) {
    local_3a8 = &(pJVar11->mShiftedData)._M_t._M_impl.super__Rb_tree_header._M_header;
    uVar10 = 0;
    do {
      AnalyzerResults::GetFrame((ulonglong)&local_3d0);
      local_2f8 = local_3b0;
      local_308 = local_3d0.field_2._M_allocated_capacity;
      uStack_300 = local_3d0.field_2._8_8_;
      local_318 = local_3d0._M_dataplus._M_p;
      sStack_310 = local_3d0._M_string_length;
      Frame::~Frame((Frame *)&local_3d0);
      format = 0x80;
      AnalyzerHelpers::GetTimeString((ulonglong)local_318,local_320,local_3d4,local_2b8,0x80);
      bVar1 = (byte)local_2f8;
      uVar9 = (ulong)(byte)local_2f8;
      local_378 = 0;
      *local_380 = '\0';
      local_398 = 0;
      *local_3a0 = '\0';
      local_338 = 0;
      *local_340 = '\0';
      local_358 = 0;
      *local_360 = '\0';
      if ((bVar1 == 0xb) || (bVar1 == 4)) {
        local_2f0 = local_318;
        p_Var5 = (pJVar11->mShiftedData)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var7 = local_3a8;
        if (p_Var5 != (_Base_ptr)0x0) {
          do {
            if (*(pointer *)(p_Var5 + 1) >= local_318) {
              p_Var7 = p_Var5;
            }
            p_Var5 = (&p_Var5->_M_left)[*(pointer *)(p_Var5 + 1) < local_318];
          } while (p_Var5 != (_Base_ptr)0x0);
          if ((p_Var7 != local_3a8) && (*(pointer *)(p_Var7 + 1) <= local_318)) {
            JtagShiftedData::GetStringFromBitStates_abi_cxx11_
                      (&local_3d0,(JtagShiftedData *)&p_Var7[1]._M_parent,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(ulong)local_3ec,
                       Decimal,format);
            std::__cxx11::string::operator=((string *)&local_380,(string *)&local_3d0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
              operator_delete(local_3d0._M_dataplus._M_p);
            }
            JtagShiftedData::GetStringFromBitStates_abi_cxx11_
                      (&local_3d0,(JtagShiftedData *)(p_Var7 + 2),
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(ulong)local_3ec,
                       Decimal,format);
            std::__cxx11::string::operator=((string *)&local_3a0,(string *)&local_3d0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
              operator_delete(local_3d0._M_dataplus._M_p);
            }
            pJVar11 = local_3e8;
            if (local_3e8->mSettings->mShowBitCount == true) {
              JtagShiftedData::GetTDILengthString_abi_cxx11_
                        (&local_3d0,(JtagShiftedData *)(p_Var7 + 1),false);
              std::__cxx11::string::operator=((string *)&local_340,(string *)&local_3d0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
                operator_delete(local_3d0._M_dataplus._M_p);
              }
              JtagShiftedData::GetTDOLengthString_abi_cxx11_
                        (&local_3d0,(JtagShiftedData *)(p_Var7 + 1),false);
              std::__cxx11::string::operator=((string *)&local_360,(string *)&local_3d0);
              pJVar11 = local_3e8;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
                operator_delete(local_3d0._M_dataplus._M_p);
                pJVar11 = local_3e8;
              }
            }
          }
        }
      }
      bVar12 = pJVar11->mSettings->mShowBitCount;
      sVar3 = strlen(local_2b8);
      if (bVar12 == true) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,local_2b8,sVar3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,";",1);
        pcVar8 = "<undefined>";
        if ((bVar1 < 0x10) && (pcVar8 = TAPStateDescLong[uVar9], pcVar8 == (char *)0x0)) {
          std::ios::clear((int)auStack_3f8 + (int)*(undefined8 *)(local_230 + -0x18) + 0x1c8);
        }
        else {
          sVar3 = strlen(pcVar8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,pcVar8,sVar3);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,";",1);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_230,local_380,local_378);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,";",1);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_3a0,local_398);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,";",1);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_340,local_338);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,";",1);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_360,local_358);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,local_2b8,sVar3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,";",1);
        pcVar8 = "<undefined>";
        if ((bVar1 < 0x10) && (pcVar8 = TAPStateDescLong[uVar9], pcVar8 == (char *)0x0)) {
          std::ios::clear((int)auStack_3f8 + (int)*(undefined8 *)(local_230 + -0x18) + 0x1c8);
        }
        else {
          sVar3 = strlen(pcVar8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,pcVar8,sVar3);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,";",1);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_230,local_380,local_378);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,";",1);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_3a0,local_398);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      }
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      cVar2 = AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)pJVar11,uVar10);
      if (cVar2 != '\0') goto LAB_001098a0;
      uVar10 = uVar10 + 1;
    } while (uVar10 != local_3e0);
  }
  AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)pJVar11,local_3e0);
LAB_001098a0:
  if (local_360 != local_350) {
    operator_delete(local_360);
  }
  if (local_340 != local_330) {
    operator_delete(local_340);
  }
  if (local_3a0 != local_390) {
    operator_delete(local_3a0);
  }
  if (local_380 != local_370) {
    operator_delete(local_380);
  }
  if (pvStack_2d0 != (void *)0x0) {
    operator_delete(pvStack_2d0);
  }
  if (local_2e8 != (void *)0x0) {
    operator_delete(local_2e8);
  }
  Frame::~Frame((Frame *)&local_318);
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _FrameV2;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void JtagAnalyzerResults::GenerateExportFile( const char* file, DisplayBase display_base, U32 export_type_user_id )
{
    std::ofstream file_stream( file, std::ios::out );

    U64 trigger_sample = mAnalyzer->GetTriggerSample();
    U32 sample_rate = mAnalyzer->GetSampleRate();

    if( mSettings->mShowBitCount )
        file_stream << "Time [s];TAP state;TDI;TDO;TDIBitCount;TDOBitCount" << std::endl;
    else
        file_stream << "Time [s];TAP state;TDI;TDO" << std::endl;

    Frame frm;
    JtagShiftedData sd;
    std::set<JtagShiftedData>::iterator sdi;
    char time_str[ 128 ];
    std::string tdi_str, tdo_str, tdi_count_str, tdo_count_str;
    const U64 num_frames = GetNumFrames();
    for( U64 fcnt = 0; fcnt < num_frames; fcnt++ )
    {
        // get the frame
        frm = GetFrame( fcnt );

        // make the time string
        AnalyzerHelpers::GetTimeString( frm.mStartingSampleInclusive, trigger_sample, sample_rate, time_str, sizeof( time_str ) );

        // get the TAP state
        JtagTAPState tap_state = ( JtagTAPState )frm.mType;

        // make the TDI/TDO data if we're in a shift state
        tdi_str.clear();
        tdo_str.clear();
        tdi_count_str.clear();
        tdo_count_str.clear();
        if( tap_state == ShiftIR || tap_state == ShiftDR )
        {
            // find TDI/TDO data
            sd.mStartSampleIndex = frm.mStartingSampleInclusive;
            sdi = mShiftedData.find( sd );

            // found?
            if( sdi != mShiftedData.end() )
            {
                tdi_str = sdi->GetTDIString( display_base, JtagShiftedData::TdiTdoStringFormat::Break64 );
                tdo_str = sdi->GetTDOString( display_base, JtagShiftedData::TdiTdoStringFormat::Break64 );

                if( mSettings->mShowBitCount )
                {
                    tdi_count_str = sdi->GetTDILengthString( false );
                    tdo_count_str = sdi->GetTDOLengthString( false );
                }
            }
        }

        // output
        if( mSettings->mShowBitCount )
            file_stream << time_str << ";" << GetStateDescLong( tap_state ) << ";" << tdi_str << ";" << tdo_str << ";" << tdi_count_str
                        << ";" << tdo_count_str << std::endl;
        else
            file_stream << time_str << ";" << GetStateDescLong( tap_state ) << ";" << tdi_str << ";" << tdo_str << std::endl;

        if( UpdateExportProgressAndCheckForCancel( fcnt, num_frames ) )
            return;
    }

    // end
    UpdateExportProgressAndCheckForCancel( num_frames, num_frames );
}